

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtCountOnesVecMask(word *x,word *pMask,int nWords,int fCompl)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 0;
  if (nWords < 1) {
    nWords = 0;
  }
  uVar3 = 0;
  if (fCompl == 0) {
    for (; (uint)nWords != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = Abc_TtCountOnes(x[uVar3] & pMask[uVar3]);
      iVar2 = iVar2 + iVar1;
    }
  }
  else {
    for (; (uint)nWords != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = Abc_TtCountOnes(~x[uVar3] & pMask[uVar3]);
      iVar2 = iVar2 + iVar1;
    }
  }
  return iVar2;
}

Assistant:

static inline int Abc_TtCountOnesVecMask( word * x, word * pMask, int nWords, int fCompl )
{
    int w, Count = 0;
    if ( fCompl )
        for ( w = 0; w < nWords; w++ )
            Count += Abc_TtCountOnes( pMask[w] & ~x[w] );
    else
        for ( w = 0; w < nWords; w++ )
            Count += Abc_TtCountOnes( pMask[w] & x[w] );
    return Count;
}